

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_null_istream<char>::basic_null_istream(basic_null_istream<char> *this)

{
  null_buffer *in_RDI;
  
  std::ios::ios((ios *)&in_RDI[1].field_0x10);
  *(undefined8 *)in_RDI = 0x1332d98;
  *(undefined8 *)&in_RDI[1].field_0x10 = 0x1332dc0;
  std::istream::istream(in_RDI,(streambuf *)&PTR_construction_vtable_24__01332dd8);
  *(undefined8 *)in_RDI = 0x1332d98;
  *(undefined8 *)&in_RDI[1].field_0x10 = 0x1332dc0;
  null_buffer::null_buffer(in_RDI);
  return;
}

Assistant:

basic_null_istream()
          : std::basic_istream<CharT>(&nb_)
        {
        }